

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceIntersectorK<4>_>,_false>
::occluded(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceIntersectorK<4>_>,_false>
           *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  size_t sVar19;
  uint uVar20;
  NodeRef nodeRef;
  ulong uVar22;
  long lVar23;
  size_t sVar24;
  NodeRef *pNVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  ulong uVar27;
  size_t sVar28;
  Primitive *prim;
  bool bVar29;
  int iVar30;
  int iVar31;
  float fVar32;
  float fVar40;
  float fVar41;
  vint4 bi;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar49;
  float fVar50;
  vint4 bi_1;
  float fVar51;
  undefined1 auVar47 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar48;
  float fVar52;
  float fVar55;
  float fVar56;
  vint4 ai;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  vint4 ai_1;
  undefined1 auVar59 [16];
  float fVar62;
  float fVar63;
  float fVar65;
  float fVar66;
  vint4 ai_3;
  undefined1 auVar64 [16];
  float fVar67;
  float fVar68;
  uint uVar69;
  float fVar70;
  uint uVar71;
  uint uVar72;
  float fVar73;
  uint uVar74;
  uint uVar75;
  vint4 bi_2;
  float fVar76;
  uint uVar77;
  uint uVar78;
  float fVar79;
  float fVar81;
  float fVar82;
  vint4 bi_3;
  undefined1 auVar80 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  uint uVar86;
  float fVar87;
  float fVar88;
  uint uVar89;
  float fVar90;
  float fVar91;
  uint uVar92;
  vint4 ai_2;
  float fVar93;
  float fVar94;
  uint uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  int iVar98;
  int iVar99;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar100;
  vbool<4> vVar101;
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid0;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  ulong uVar21;
  
  lVar23 = (valid_i->field_0).v[0];
  sVar28 = *(size_t *)(lVar23 + 0x70);
  if (sVar28 != 8) {
    if ((*(long *)(ray + 8) != 0) &&
       (lVar23 = *(long *)(ray + 0x10), (*(byte *)(lVar23 + 2) & 1) != 0)) {
      occludedCoherent(this,valid_i,This,ray,context);
      return;
    }
    auVar96._8_4_ = 0xffffffff;
    auVar96._0_8_ = 0xffffffffffffffff;
    auVar96._12_4_ = 0xffffffff;
    auVar45 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
    auVar97._0_8_ =
         CONCAT44(-(uint)(*(int *)(this + 4) == -1 && 0.0 <= auVar45._4_4_),
                  -(uint)(*(int *)this == -1 && 0.0 <= auVar45._0_4_));
    auVar97._8_4_ = -(uint)(*(int *)(this + 8) == -1 && 0.0 <= auVar45._8_4_);
    auVar97._12_4_ = -(uint)(*(int *)(this + 0xc) == -1 && 0.0 <= auVar45._12_4_);
    uVar20 = movmskps((int)lVar23,auVar97);
    uVar21 = (ulong)uVar20;
    if (uVar20 != 0) {
      fVar7 = *(float *)&This->ptr;
      fVar8 = *(float *)((long)&This->ptr + 4);
      fVar9 = *(float *)&This->leafIntersector;
      fVar10 = *(float *)((long)&This->leafIntersector + 4);
      fVar11 = *(float *)&(This->collider).collide;
      fVar12 = *(float *)((long)&(This->collider).collide + 4);
      fVar13 = *(float *)&(This->collider).name;
      fVar14 = *(float *)((long)&(This->collider).name + 4);
      fVar15 = *(float *)&(This->intersector1).intersect;
      fVar16 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar17 = *(float *)&(This->intersector1).occluded;
      fVar18 = *(float *)((long)&(This->intersector1).occluded + 4);
      auVar80._0_8_ = (This->intersector1).pointQuery;
      auVar80._8_8_ = (This->intersector1).name;
      auVar59._0_8_ = (This->intersector4).intersect;
      auVar59._8_8_ = (This->intersector4).occluded;
      fVar84 = (float)DAT_01f80d30;
      fVar87 = DAT_01f80d30._4_4_;
      fVar90 = DAT_01f80d30._8_4_;
      fVar93 = DAT_01f80d30._12_4_;
      auVar53._4_4_ = -(uint)(ABS((float)((ulong)auVar59._0_8_ >> 0x20)) < fVar87);
      auVar53._0_4_ = -(uint)(ABS((float)auVar59._0_8_) < fVar84);
      auVar53._8_4_ = -(uint)(ABS((float)auVar59._8_8_) < fVar90);
      auVar53._12_4_ = -(uint)(ABS((float)((ulong)auVar59._8_8_ >> 0x20)) < fVar93);
      auVar53 = blendvps(auVar59,_DAT_01f80d30,auVar53);
      auVar59 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar33._4_4_ = -(uint)(ABS(auVar59._4_4_) < fVar87);
      auVar33._0_4_ = -(uint)(ABS(auVar59._0_4_) < fVar84);
      auVar33._8_4_ = -(uint)(ABS(auVar59._8_4_) < fVar90);
      auVar33._12_4_ = -(uint)(ABS(auVar59._12_4_) < fVar93);
      auVar59 = blendvps(auVar59,_DAT_01f80d30,auVar33);
      auVar64._0_8_ = (This->intersector4_filter).occluded;
      auVar64._8_8_ = (This->intersector4_filter).name;
      iVar30 = -(uint)(ABS((float)auVar64._8_8_) < fVar90);
      iVar31 = -(uint)(ABS((float)((ulong)auVar64._8_8_ >> 0x20)) < fVar93);
      auVar43._0_8_ =
           CONCAT44(-(uint)(ABS((float)((ulong)auVar64._0_8_ >> 0x20)) < fVar87),
                    -(uint)(ABS((float)auVar64._0_8_) < fVar84));
      auVar43._8_4_ = iVar30;
      auVar43._12_4_ = iVar31;
      auVar34._8_4_ = iVar30;
      auVar34._0_8_ = auVar43._0_8_;
      auVar34._12_4_ = iVar31;
      auVar64 = blendvps(auVar64,_DAT_01f80d30,auVar34);
      auVar80 = maxps(auVar80,ZEXT816(0));
      iVar30 = (int)DAT_01f7a9f0;
      iVar31 = DAT_01f7a9f0._4_4_;
      iVar98 = DAT_01f7a9f0._8_4_;
      iVar99 = DAT_01f7a9f0._12_4_;
      auVar35._8_4_ = auVar97._8_4_;
      auVar35._0_8_ = auVar97._0_8_;
      auVar35._12_4_ = auVar97._12_4_;
      aVar100.v = (__m128)blendvps(_DAT_01f7a9f0,auVar80,auVar35);
      auVar96 = auVar96 ^ auVar97;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = sVar28;
      stack_near[1].field_0 = aVar100;
      if (sVar28 != 0xfffffffffffffff8) {
        auVar80 = rcpps(auVar35,auVar53);
        fVar84 = auVar80._0_4_;
        auVar54._0_4_ = auVar53._0_4_ * fVar84;
        fVar87 = auVar80._4_4_;
        auVar54._4_4_ = auVar53._4_4_ * fVar87;
        fVar90 = auVar80._8_4_;
        auVar54._8_4_ = auVar53._8_4_ * fVar90;
        fVar93 = auVar80._12_4_;
        auVar54._12_4_ = auVar53._12_4_ * fVar93;
        auVar80 = rcpps(auVar43,auVar59);
        fVar85 = auVar80._0_4_;
        fVar88 = auVar80._4_4_;
        fVar91 = auVar80._8_4_;
        fVar94 = auVar80._12_4_;
        auVar80 = rcpps(auVar54,auVar64);
        fVar68 = auVar80._0_4_;
        fVar70 = auVar80._4_4_;
        fVar73 = auVar80._8_4_;
        fVar76 = auVar80._12_4_;
        fVar85 = (1.0 - auVar59._0_4_ * fVar85) * fVar85 + fVar85;
        fVar88 = (1.0 - auVar59._4_4_ * fVar88) * fVar88 + fVar88;
        fVar91 = (1.0 - auVar59._8_4_ * fVar91) * fVar91 + fVar91;
        fVar94 = (1.0 - auVar59._12_4_ * fVar94) * fVar94 + fVar94;
        fVar84 = (1.0 - auVar54._0_4_) * fVar84 + fVar84;
        fVar87 = (1.0 - auVar54._4_4_) * fVar87 + fVar87;
        fVar90 = (1.0 - auVar54._8_4_) * fVar90 + fVar90;
        fVar93 = (1.0 - auVar54._12_4_) * fVar93 + fVar93;
        fVar68 = (1.0 - auVar64._0_4_ * fVar68) * fVar68 + fVar68;
        fVar70 = (1.0 - auVar64._4_4_ * fVar70) * fVar70 + fVar70;
        fVar73 = (1.0 - auVar64._8_4_ * fVar73) * fVar73 + fVar73;
        fVar76 = (1.0 - auVar64._12_4_ * fVar76) * fVar76 + fVar76;
        auVar80 = maxps(auVar45,ZEXT816(0));
        auVar45._8_4_ = auVar97._8_4_;
        auVar45._0_8_ = auVar97._0_8_;
        auVar45._12_4_ = auVar97._12_4_;
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       blendvps(_DAT_01f7aa00,auVar80,auVar45);
        pNVar25 = stack_node + 1;
        paVar26 = &stack_near[2].field_0;
LAB_0024282b:
        aVar44 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar26[-1].v;
        paVar26 = paVar26 + -1;
        auVar36._4_4_ = -(uint)(aVar44.v[1] < (float)bi_8.field_0.i[1]);
        auVar36._0_4_ = -(uint)(aVar44.v[0] < (float)bi_8.field_0.i[0]);
        auVar36._8_4_ = -(uint)(aVar44.v[2] < (float)bi_8.field_0.i[2]);
        auVar36._12_4_ = -(uint)(aVar44._12_4_ < (float)bi_8.field_0.i[3]);
        uVar20 = movmskps((int)uVar21,auVar36);
        uVar21 = (ulong)uVar20;
        if (uVar20 != 0) {
          do {
            if ((sVar28 & 8) != 0) {
              if (sVar28 == 0xfffffffffffffff8) goto LAB_00242abe;
              auVar38._4_4_ = -(uint)(aVar44.v[1] < (float)bi_8.field_0.i[1]);
              auVar38._0_4_ = -(uint)(aVar44.v[0] < (float)bi_8.field_0.i[0]);
              auVar38._8_4_ = -(uint)(aVar44.v[2] < (float)bi_8.field_0.i[2]);
              auVar38._12_4_ = -(uint)(aVar44.v[3] < (float)bi_8.field_0.i[3]);
              uVar20 = movmskps((int)uVar21,auVar38);
              uVar21 = (ulong)uVar20;
              if (uVar20 != 0) {
                valid0.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar96 ^ _DAT_01f7ae20);
                uVar22 = (ulong)((uint)sVar28 & 0xf) - 8;
                uVar21 = uVar22;
                auVar39 = auVar96;
                if (uVar22 == 0) goto LAB_00242a94;
                prim = (Primitive *)(sVar28 & 0xfffffffffffffff0);
                uVar27 = 1;
                goto LAB_00242a0d;
              }
              break;
            }
            lVar23 = 0;
            aVar44.i[1] = iVar31;
            aVar44.i[0] = iVar30;
            aVar44.i[2] = iVar98;
            aVar44.i[3] = iVar99;
            sVar24 = 8;
            do {
              sVar1 = *(size_t *)((sVar28 & 0xfffffffffffffff0) + lVar23 * 8);
              if (sVar1 == 8) break;
              fVar83 = *(float *)(sVar28 + 0x20 + lVar23 * 4);
              fVar42 = *(float *)(sVar28 + 0x30 + lVar23 * 4);
              fVar32 = *(float *)(sVar28 + 0x40 + lVar23 * 4);
              fVar51 = *(float *)(sVar28 + 0x50 + lVar23 * 4);
              fVar52 = (fVar83 - fVar7) * fVar84;
              fVar55 = (fVar83 - fVar8) * fVar87;
              fVar56 = (fVar83 - fVar9) * fVar90;
              fVar57 = (fVar83 - fVar10) * fVar93;
              fVar58 = (fVar32 - fVar11) * fVar85;
              fVar60 = (fVar32 - fVar12) * fVar88;
              fVar61 = (fVar32 - fVar13) * fVar91;
              fVar62 = (fVar32 - fVar14) * fVar94;
              fVar83 = *(float *)(sVar28 + 0x60 + lVar23 * 4);
              fVar63 = (fVar83 - fVar15) * fVar68;
              fVar65 = (fVar83 - fVar16) * fVar70;
              fVar66 = (fVar83 - fVar17) * fVar73;
              fVar67 = (fVar83 - fVar18) * fVar76;
              fVar32 = (fVar42 - fVar7) * fVar84;
              fVar40 = (fVar42 - fVar8) * fVar87;
              fVar41 = (fVar42 - fVar9) * fVar90;
              fVar42 = (fVar42 - fVar10) * fVar93;
              fVar46 = (fVar51 - fVar11) * fVar85;
              fVar49 = (fVar51 - fVar12) * fVar88;
              fVar50 = (fVar51 - fVar13) * fVar91;
              fVar51 = (fVar51 - fVar14) * fVar94;
              fVar83 = *(float *)(sVar28 + 0x70 + lVar23 * 4);
              fVar79 = (fVar83 - fVar15) * fVar68;
              fVar81 = (fVar83 - fVar16) * fVar70;
              fVar82 = (fVar83 - fVar17) * fVar73;
              fVar83 = (fVar83 - fVar18) * fVar76;
              uVar20 = (uint)((int)fVar32 < (int)fVar52) * (int)fVar32 |
                       (uint)((int)fVar32 >= (int)fVar52) * (int)fVar52;
              uVar71 = (uint)((int)fVar40 < (int)fVar55) * (int)fVar40 |
                       (uint)((int)fVar40 >= (int)fVar55) * (int)fVar55;
              uVar74 = (uint)((int)fVar41 < (int)fVar56) * (int)fVar41 |
                       (uint)((int)fVar41 >= (int)fVar56) * (int)fVar56;
              uVar77 = (uint)((int)fVar42 < (int)fVar57) * (int)fVar42 |
                       (uint)((int)fVar42 >= (int)fVar57) * (int)fVar57;
              uVar86 = (uint)((int)fVar46 < (int)fVar58) * (int)fVar46 |
                       (uint)((int)fVar46 >= (int)fVar58) * (int)fVar58;
              uVar89 = (uint)((int)fVar49 < (int)fVar60) * (int)fVar49 |
                       (uint)((int)fVar49 >= (int)fVar60) * (int)fVar60;
              uVar92 = (uint)((int)fVar50 < (int)fVar61) * (int)fVar50 |
                       (uint)((int)fVar50 >= (int)fVar61) * (int)fVar61;
              uVar95 = (uint)((int)fVar51 < (int)fVar62) * (int)fVar51 |
                       (uint)((int)fVar51 >= (int)fVar62) * (int)fVar62;
              uVar86 = ((int)uVar86 < (int)uVar20) * uVar20 | ((int)uVar86 >= (int)uVar20) * uVar86;
              uVar89 = ((int)uVar89 < (int)uVar71) * uVar71 | ((int)uVar89 >= (int)uVar71) * uVar89;
              uVar92 = ((int)uVar92 < (int)uVar74) * uVar74 | ((int)uVar92 >= (int)uVar74) * uVar92;
              uVar95 = ((int)uVar95 < (int)uVar77) * uVar77 | ((int)uVar95 >= (int)uVar77) * uVar95;
              uVar20 = (uint)((int)fVar79 < (int)fVar63) * (int)fVar79 |
                       (uint)((int)fVar79 >= (int)fVar63) * (int)fVar63;
              uVar71 = (uint)((int)fVar81 < (int)fVar65) * (int)fVar81 |
                       (uint)((int)fVar81 >= (int)fVar65) * (int)fVar65;
              uVar74 = (uint)((int)fVar82 < (int)fVar66) * (int)fVar82 |
                       (uint)((int)fVar82 >= (int)fVar66) * (int)fVar66;
              uVar77 = (uint)((int)fVar83 < (int)fVar67) * (int)fVar83 |
                       (uint)((int)fVar83 >= (int)fVar67) * (int)fVar67;
              uVar69 = ((int)uVar20 < (int)uVar86) * uVar86 | ((int)uVar20 >= (int)uVar86) * uVar20;
              uVar72 = ((int)uVar71 < (int)uVar89) * uVar89 | ((int)uVar71 >= (int)uVar89) * uVar71;
              uVar75 = ((int)uVar74 < (int)uVar92) * uVar92 | ((int)uVar74 >= (int)uVar92) * uVar74;
              uVar78 = ((int)uVar77 < (int)uVar95) * uVar95 | ((int)uVar77 >= (int)uVar95) * uVar77;
              uVar20 = (uint)((int)fVar32 < (int)fVar52) * (int)fVar52 |
                       (uint)((int)fVar32 >= (int)fVar52) * (int)fVar32;
              uVar71 = (uint)((int)fVar40 < (int)fVar55) * (int)fVar55 |
                       (uint)((int)fVar40 >= (int)fVar55) * (int)fVar40;
              uVar74 = (uint)((int)fVar41 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar41 >= (int)fVar56) * (int)fVar41;
              uVar77 = (uint)((int)fVar42 < (int)fVar57) * (int)fVar57 |
                       (uint)((int)fVar42 >= (int)fVar57) * (int)fVar42;
              uVar86 = (uint)((int)fVar46 < (int)fVar58) * (int)fVar58 |
                       (uint)((int)fVar46 >= (int)fVar58) * (int)fVar46;
              uVar89 = (uint)((int)fVar49 < (int)fVar60) * (int)fVar60 |
                       (uint)((int)fVar49 >= (int)fVar60) * (int)fVar49;
              uVar92 = (uint)((int)fVar50 < (int)fVar61) * (int)fVar61 |
                       (uint)((int)fVar50 >= (int)fVar61) * (int)fVar50;
              uVar95 = (uint)((int)fVar51 < (int)fVar62) * (int)fVar62 |
                       (uint)((int)fVar51 >= (int)fVar62) * (int)fVar51;
              uVar20 = ((int)uVar20 < (int)uVar86) * uVar20 | ((int)uVar20 >= (int)uVar86) * uVar86;
              uVar71 = ((int)uVar71 < (int)uVar89) * uVar71 | ((int)uVar71 >= (int)uVar89) * uVar89;
              uVar74 = ((int)uVar74 < (int)uVar92) * uVar74 | ((int)uVar74 >= (int)uVar92) * uVar92;
              uVar77 = ((int)uVar77 < (int)uVar95) * uVar77 | ((int)uVar77 >= (int)uVar95) * uVar95;
              uVar86 = (uint)((int)fVar79 < (int)fVar63) * (int)fVar63 |
                       (uint)((int)fVar79 >= (int)fVar63) * (int)fVar79;
              uVar89 = (uint)((int)fVar81 < (int)fVar65) * (int)fVar65 |
                       (uint)((int)fVar81 >= (int)fVar65) * (int)fVar81;
              uVar92 = (uint)((int)fVar82 < (int)fVar66) * (int)fVar66 |
                       (uint)((int)fVar82 >= (int)fVar66) * (int)fVar82;
              uVar95 = (uint)((int)fVar83 < (int)fVar67) * (int)fVar67 |
                       (uint)((int)fVar83 >= (int)fVar67) * (int)fVar83;
              iVar2 = aVar100.i[0];
              iVar3 = aVar100.i[1];
              iVar4 = aVar100.i[2];
              iVar5 = aVar100.i[3];
              uVar86 = (uint)(bi_8.field_0.i[0] < (int)uVar86) * bi_8.field_0.i[0] |
                       (bi_8.field_0.i[0] >= (int)uVar86) * uVar86;
              uVar89 = (uint)(bi_8.field_0.i[1] < (int)uVar89) * bi_8.field_0.i[1] |
                       (bi_8.field_0.i[1] >= (int)uVar89) * uVar89;
              uVar92 = (uint)(bi_8.field_0.i[2] < (int)uVar92) * bi_8.field_0.i[2] |
                       (bi_8.field_0.i[2] >= (int)uVar92) * uVar92;
              uVar95 = (uint)(bi_8.field_0.i[3] < (int)uVar95) * bi_8.field_0.i[3] |
                       (bi_8.field_0.i[3] >= (int)uVar95) * uVar95;
              auVar37._4_4_ =
                   -(uint)((float)((uint)((int)uVar72 < iVar3) * iVar3 |
                                  ((int)uVar72 >= iVar3) * uVar72) <=
                          (float)(((int)uVar71 < (int)uVar89) * uVar71 |
                                 ((int)uVar71 >= (int)uVar89) * uVar89));
              auVar37._0_4_ =
                   -(uint)((float)((uint)((int)uVar69 < iVar2) * iVar2 |
                                  ((int)uVar69 >= iVar2) * uVar69) <=
                          (float)(((int)uVar20 < (int)uVar86) * uVar20 |
                                 ((int)uVar20 >= (int)uVar86) * uVar86));
              auVar37._8_4_ =
                   -(uint)((float)((uint)((int)uVar75 < iVar4) * iVar4 |
                                  ((int)uVar75 >= iVar4) * uVar75) <=
                          (float)(((int)uVar74 < (int)uVar92) * uVar74 |
                                 ((int)uVar74 >= (int)uVar92) * uVar92));
              auVar37._12_4_ =
                   -(uint)((float)((uint)((int)uVar78 < iVar5) * iVar5 |
                                  ((int)uVar78 >= iVar5) * uVar78) <=
                          (float)(((int)uVar77 < (int)uVar95) * uVar77 |
                                 ((int)uVar77 >= (int)uVar95) * uVar95));
              uVar20 = movmskps((int)this,auVar37);
              this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceIntersectorK<4>_>,_false>
                      *)(ulong)uVar20;
              sVar19 = sVar24;
              aVar48 = aVar44;
              if ((uVar20 != 0) &&
                 (auVar47._4_4_ = iVar31, auVar47._0_4_ = iVar30, auVar47._8_4_ = iVar98,
                 auVar47._12_4_ = iVar99, auVar6._4_4_ = uVar72, auVar6._0_4_ = uVar69,
                 auVar6._8_4_ = uVar75, auVar6._12_4_ = uVar78,
                 aVar48 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                          blendvps(auVar47,auVar6,auVar37), sVar19 = sVar1, sVar24 != 8)) {
                pNVar25->ptr = sVar24;
                pNVar25 = pNVar25 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar26->v = aVar44;
                paVar26 = paVar26 + 1;
              }
              aVar44 = aVar48;
              sVar24 = sVar19;
              lVar23 = lVar23 + 1;
            } while (lVar23 != 4);
            uVar21 = sVar28;
            sVar28 = sVar24;
          } while (sVar24 != 8);
        }
        goto LAB_0024299c;
      }
LAB_00242abe:
      auVar45 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f7aa00,
                         auVar97 & auVar96);
      *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar45;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    uVar21 = uVar27 + 1;
    bVar29 = uVar22 <= uVar27;
    uVar27 = uVar21;
    if (bVar29) break;
LAB_00242a0d:
    this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceIntersectorK<4>_>,_false>
            *)&local_16e8;
    vVar101 = InstanceIntersectorK<4>::occluded
                        ((InstanceIntersectorK<4> *)this,&valid0,&pre,(RayK<4> *)This,
                         (RayQueryContext *)ray,prim);
    valid0.field_0.i[0] = ~local_16e8 & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~uStack_16e4 & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~uStack_16e0 & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~uStack_16dc & valid0.field_0.i[3];
    uVar20 = movmskps(vVar101.field_0._0_4_,(undefined1  [16])valid0.field_0);
    uVar21 = (ulong)uVar20;
    if (uVar20 == 0) break;
  }
  uVar22 = CONCAT44(valid0.field_0.i[1],valid0.field_0.i[0]);
  auVar39._0_8_ = uVar22 ^ 0xffffffffffffffff;
  auVar39._8_4_ = valid0.field_0.i[2] ^ 0xffffffff;
  auVar39._12_4_ = valid0.field_0.i[3] ^ 0xffffffff;
  iVar30 = 0x7f800000;
  iVar31 = 0x7f800000;
  iVar98 = 0x7f800000;
  iVar99 = 0x7f800000;
LAB_00242a94:
  auVar96 = auVar96 | auVar39;
  uVar20 = movmskps((int)uVar21,auVar96);
  uVar21 = (ulong)uVar20;
  if (uVar20 == 0xf) goto LAB_00242abe;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps((undefined1  [16])bi_8.field_0,_DAT_01f7aa00,auVar96);
LAB_0024299c:
  sVar28 = pNVar25[-1].ptr;
  pNVar25 = pNVar25 + -1;
  if (sVar28 == 0xfffffffffffffff8) goto LAB_00242abe;
  goto LAB_0024282b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }